

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_add.c
# Opt level: O3

int mpt_valfmt_add(mpt_array *arr,mpt_value_format fmt)

{
  mpt_type_traits *pmVar1;
  mpt_buffer *pmVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  pmVar1 = mpt_type_traits(0x18);
  iVar3 = -4;
  if (pmVar1 != (mpt_type_traits *)0x0) {
    pmVar2 = arr->_buf;
    if (pmVar2 == (mpt_buffer *)0x0) {
      pmVar2 = _mpt_buffer_alloc(0x20,0);
      if (pmVar2 != (mpt_buffer *)0x0) {
        *(mpt_value_format *)&pmVar2[1]._vptr = fmt;
        pmVar2->_used = 4;
        pmVar2->_content_traits = pmVar1;
        arr->_buf = pmVar2;
        iVar3 = 1;
      }
    }
    else {
      iVar3 = -3;
      if (pmVar1 == pmVar2->_content_traits) {
        uVar4 = pmVar2->_used;
        uVar5 = uVar4 & 0xfffffffffffffffc;
        pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,uVar5 + 0x20);
        if (pmVar2 == (mpt_buffer *)0x0) {
          iVar3 = 0;
        }
        else {
          uVar4 = uVar4 >> 2;
          arr->_buf = pmVar2;
          *(mpt_value_format *)((long)&pmVar2[1]._vptr + uVar5) = fmt;
          iVar3 = (int)uVar4 + 1;
          pmVar2->_used = uVar4 * 4 + 4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_valfmt_add(_MPT_UARRAY_TYPE(value_format) *arr, MPT_STRUCT(value_format) fmt)
{
	const MPT_STRUCT(type_traits) *traits = mpt_type_traits(MPT_ENUM(TypeValFmt));
	MPT_STRUCT(buffer) *b;
	MPT_STRUCT(value_format) *dest;
	long len;
	
	if (!traits) {
		return MPT_ERROR(BadOperation);
	}
	
	if (!(b = arr->_buf)) {
		if (!(b = _mpt_buffer_alloc(8 * sizeof(fmt), 0))) {
			return MPT_ERROR(BadOperation);
		}
		memcpy(b + 1, &fmt, sizeof(fmt));
		b->_used = sizeof(fmt);
		b->_content_traits = traits;
		arr->_buf = b;
		return 1;
	}
	if (traits != b->_content_traits) {
		return MPT_ERROR(BadType);
	}
	len = b->_used / sizeof(fmt);
	if (!(b = b->_vptr->detach(b, (len + 8) * sizeof(fmt)))) {
		return 0;
	}
	arr->_buf = b;
	dest = (void *) (b + 1);
	memcpy(dest + len, &fmt, sizeof(fmt));
	++len;
	b->_used = len * sizeof(fmt);
	return len;
}